

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O3

void __thiscall re2c::Node::Node(Node *this)

{
  _Rb_tree_header *p_Var1;
  rule_rank_t rVar2;
  
  p_Var1 = &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->arcs)._M_t._M_impl = 0;
  *(undefined8 *)&(this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->arcsets)._M_t._M_impl.super__Rb_tree_header;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->arcsets)._M_t._M_impl = 0;
  *(undefined8 *)&(this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->loop = '\0';
  rVar2 = rule_rank_t::none();
  (this->rule).rank.value = rVar2.value;
  (this->rule).restorectx = false;
  this->ctx = false;
  this->dist = 0xffffffff;
  p_Var1 = &(this->reachable)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->reachable)._M_t._M_impl = 0;
  *(undefined8 *)&(this->reachable)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reachable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reachable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reachable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->reachable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->suffix = (path_t *)0x0;
  return;
}

Assistant:

Node::Node ()
	: arcs ()
	, arcsets ()
	, loop (0)
	, rule (rule_rank_t::none (), false)
	, ctx (false)
	, dist (DIST_ERROR)
	, reachable ()
	, suffix (NULL)
{}